

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O1

string * directories::MADPGetResultsDir
                   (string *__return_storage_ptr__,string *method,
                   MultiAgentDecisionProcessInterface *problem)

{
  string local_38;
  
  (*problem->_vptr_MultiAgentDecisionProcessInterface[4])(&local_38,problem);
  MADPGetResultsDir(__return_storage_ptr__,method,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string
directories::MADPGetResultsDir(const string & method,
                               const MultiAgentDecisionProcessInterface
                               *problem)
{
    return(MADPGetResultsDir(method,problem->GetUnixName()));
}